

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O2

void Fra_ClassesLatchCorr(Fra_Man_t *p)

{
  Fra_Cla_t *pFVar1;
  Aig_Man_t *pAVar2;
  void *Entry;
  Aig_Obj_t **ppAVar3;
  int i;
  
  p->pCla->vClasses1->nSize = 0;
  pAVar2 = p->pManAig;
  for (i = pAVar2->nObjs[2] - pAVar2->nRegs; i < pAVar2->vCis->nSize; i = i + 1) {
    Entry = Vec_PtrEntry(pAVar2->vCis,i);
    Vec_PtrPush(p->pCla->vClasses1,Entry);
    *(Aig_Obj_t **)
     (*(long *)(*(long *)(*(long *)((long)Entry + 0x28) + 0x30) + 8) +
     (long)*(int *)((long)Entry + 0x24) * 8) = p->pManAig->pConst1;
    pAVar2 = p->pManAig;
  }
  pFVar1 = p->pCla;
  ppAVar3 = (Aig_Obj_t **)malloc((long)pFVar1->vClasses1->nSize << 4);
  pFVar1->pMemClasses = ppAVar3;
  pFVar1->pMemClassesFree = ppAVar3;
  return;
}

Assistant:

void Fra_ClassesLatchCorr( Fra_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, nEntries = 0;
    Vec_PtrClear( p->pCla->vClasses1 );
    Aig_ManForEachLoSeq( p->pManAig, pObj, i )
    {
        Vec_PtrPush( p->pCla->vClasses1, pObj );
        Fra_ClassObjSetRepr( pObj, Aig_ManConst1(p->pManAig) );
    }
    // allocate room for classes
    p->pCla->pMemClasses = ABC_ALLOC( Aig_Obj_t *, 2*(nEntries + Vec_PtrSize(p->pCla->vClasses1)) );
    p->pCla->pMemClassesFree = p->pCla->pMemClasses + 2*nEntries;
}